

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BronKerbosch.cpp
# Opt level: O3

void __thiscall BronKerbosch::~BronKerbosch(BronKerbosch *this)

{
  pointer ppAVar1;
  AlignmentRecord *this_00;
  list<unsigned_long,_std::allocator<unsigned_long>_> *plVar2;
  _List_node_base *p_Var3;
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *this_01;
  _List_node_base *p_Var4;
  AlignmentRecord **alignment;
  pointer ppAVar5;
  
  (this->super_CliqueFinder)._vptr_CliqueFinder = (_func_int **)&PTR__BronKerbosch_001b7d68;
  if ((this->super_CliqueFinder).cliques != (clique_list_t *)0x0) {
    finish(this);
  }
  ppAVar1 = (this->alignments_).
            super__Vector_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppAVar5 = (this->alignments_).
                 super__Vector_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppAVar5 != ppAVar1; ppAVar5 = ppAVar5 + 1) {
    this_00 = *ppAVar5;
    if (this_00 != (AlignmentRecord *)0x0) {
      AlignmentRecord::~AlignmentRecord(this_00);
    }
    operator_delete(this_00);
  }
  plVar2 = this->order_;
  if (plVar2 != (list<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
    p_Var4 = (plVar2->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             _M_node.super__List_node_base._M_next;
    while (p_Var4 != (_List_node_base *)plVar2) {
      p_Var3 = (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var4->_M_next)->
               _M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var4);
      p_Var4 = p_Var3;
    }
  }
  operator_delete(plVar2);
  this_01 = this->vertices_;
  if (this_01 !=
      (vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
       *)0x0) {
    std::
    vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector(this_01);
  }
  operator_delete(this_01);
  ppAVar5 = (this->alignments_).
            super__Vector_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppAVar5 == (pointer)0x0) {
    return;
  }
  operator_delete(ppAVar5);
  return;
}

Assistant:

BronKerbosch::~BronKerbosch() {
    if (cliques != nullptr) {
        finish();
    }
    for (auto&& alignment : alignments_) {
        delete alignment;
    }
    delete order_;
    delete vertices_;
}